

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O1

uchar * nvpair_pack_string_array(nvpair_t *nvp,uchar *ptr,size_t *leftp)

{
  bool bVar1;
  char **ppcVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  uchar *local_48;
  
  if (nvp == (nvpair_t *)0x0) {
    pcVar4 = "(nvp) != ((void*)0)";
  }
  else {
    if (nvp->nvp_magic == 0x6e7670) {
      if (nvp->nvp_type != 10) {
        __assert_fail("nvp->nvp_type == 10",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                      ,0x221,
                      "unsigned char *nvpair_pack_string_array(const nvpair_t *, unsigned char *, size_t *)"
                     );
      }
      if (*leftp < nvp->nvp_datasize) {
        __assert_fail("*leftp >= nvp->nvp_datasize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                      ,0x222,
                      "unsigned char *nvpair_pack_string_array(const nvpair_t *, unsigned char *, size_t *)"
                     );
      }
      ppcVar2 = nvpair_get_string_array(nvp,(size_t *)0x0);
      if (ppcVar2 == (char **)0x0) {
        __assert_fail("array != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                      ,0x226,
                      "unsigned char *nvpair_pack_string_array(const nvpair_t *, unsigned char *, size_t *)"
                     );
      }
      local_48 = ptr;
      if (nvp->nvp_nitems == 0) {
        sVar7 = 0;
      }
      else {
        sVar7 = 0;
        uVar6 = 0;
        uVar5 = 1;
        do {
          pcVar4 = ppcVar2[uVar6];
          sVar3 = strlen(pcVar4);
          uVar6 = sVar3 + 1;
          if (*leftp < uVar6) {
            __assert_fail("*leftp >= len",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                          ,0x22a,
                          "unsigned char *nvpair_pack_string_array(const nvpair_t *, unsigned char *, size_t *)"
                         );
          }
          memcpy(local_48,pcVar4,uVar6);
          sVar7 = sVar7 + uVar6;
          local_48 = local_48 + uVar6;
          *leftp = *leftp - uVar6;
          bVar1 = uVar5 < nvp->nvp_nitems;
          uVar6 = uVar5;
          uVar5 = (ulong)((int)uVar5 + 1);
        } while (bVar1);
      }
      if (sVar7 != nvp->nvp_datasize) {
        __assert_fail("size == nvp->nvp_datasize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                      ,0x232,
                      "unsigned char *nvpair_pack_string_array(const nvpair_t *, unsigned char *, size_t *)"
                     );
      }
      return local_48;
    }
    pcVar4 = "(nvp)->nvp_magic == 0x6e7670";
  }
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                ,0x220,
                "unsigned char *nvpair_pack_string_array(const nvpair_t *, unsigned char *, size_t *)"
               );
}

Assistant:

unsigned char *
nvpair_pack_string_array(const nvpair_t *nvp, unsigned char *ptr, size_t *leftp)
{
	unsigned int ii;
	size_t size, len;
	const char * const *array;

	NVPAIR_ASSERT(nvp);
	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_STRING_ARRAY);
	PJDLOG_ASSERT(*leftp >= nvp->nvp_datasize);

	size = 0;
	array = nvpair_get_string_array(nvp, NULL);
	PJDLOG_ASSERT(array != NULL);

	for (ii = 0; ii < nvp->nvp_nitems; ii++) {
		len = strlen(array[ii]) + 1;
		PJDLOG_ASSERT(*leftp >= len);

		memcpy(ptr, (const void *)array[ii], len);
		size += len;
		ptr += len;
		*leftp -= len;
	}

	PJDLOG_ASSERT(size == nvp->nvp_datasize);

	return (ptr);
}